

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

wchar_t __thiscall CVmPackPos::getch(CVmPackPos *this)

{
  wchar_t wVar1;
  int iVar2;
  
  while (this->len != 0) {
    wVar1 = utf8_ptr::getch(&this->p);
    iVar2 = is_space(wVar1);
    if (iVar2 == 0) break;
    this->idx = this->idx + 1;
    utf8_ptr::inc(&this->p,&this->len);
  }
  wVar1 = getch_raw(this);
  return wVar1;
}

Assistant:

wchar_t getch()
    {
        /* skip spaces */
        while (len != 0 && is_space(p.getch()))
        {
            ++idx;
            p.inc(&len);
        }

        /* return the current character */
        return getch_raw();
    }